

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constants.cpp
# Opt level: O0

double __thiscall spvtools::opt::analysis::Constant::GetDouble(Constant *this)

{
  int iVar1;
  uint32_t uVar2;
  Type *pTVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  bool bVar4;
  FloatConstant *fc;
  Constant *this_local;
  
  pTVar3 = type(this);
  iVar1 = (*pTVar3->_vptr_Type[0xc])();
  bVar4 = false;
  if (CONCAT44(extraout_var,iVar1) != 0) {
    pTVar3 = type(this);
    iVar1 = (*pTVar3->_vptr_Type[0xc])();
    uVar2 = Float::width((Float *)CONCAT44(extraout_var_00,iVar1));
    bVar4 = uVar2 == 0x40;
  }
  if (bVar4) {
    iVar1 = (*this->_vptr_Constant[0xf])();
    if ((FloatConstant *)CONCAT44(extraout_var_01,iVar1) == (FloatConstant *)0x0) {
      iVar1 = (*this->_vptr_Constant[0x16])();
      if (CONCAT44(extraout_var_02,iVar1) == 0) {
        __assert_fail("AsNullConstant() && \"Must be a floating point constant.\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/constants.cpp"
                      ,0x2a,"double spvtools::opt::analysis::Constant::GetDouble() const");
      }
      this_local = (Constant *)0x0;
    }
    else {
      this_local = (Constant *)
                   FloatConstant::GetDoubleValue((FloatConstant *)CONCAT44(extraout_var_01,iVar1));
    }
    return (double)this_local;
  }
  __assert_fail("type()->AsFloat() != nullptr && type()->AsFloat()->width() == 64",
                "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/constants.cpp"
                ,0x25,"double spvtools::opt::analysis::Constant::GetDouble() const");
}

Assistant:

double Constant::GetDouble() const {
  assert(type()->AsFloat() != nullptr && type()->AsFloat()->width() == 64);

  if (const FloatConstant* fc = AsFloatConstant()) {
    return fc->GetDoubleValue();
  } else {
    assert(AsNullConstant() && "Must be a floating point constant.");
    return 0.0;
  }
}